

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::val::anon_unknown_0::getStructMembers
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t struct_id,Op type,ValidationState_t *vstate)

{
  bool bVar1;
  Op OVar2;
  reference puVar3;
  Instruction *this;
  uint32_t local_5c;
  iterator iStack_58;
  uint id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ValidationState_t *vstate_local;
  Op type_local;
  uint32_t struct_id_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2,struct_id,vstate
                  );
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
  iStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffa8), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_5c = *puVar3;
    this = ValidationState_t::FindDef(vstate,local_5c);
    OVar2 = Instruction::opcode(this);
    if (type == OVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_5c);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> getStructMembers(uint32_t struct_id, spv::Op type,
                                       ValidationState_t& vstate) {
  std::vector<uint32_t> members;
  for (auto id : getStructMembers(struct_id, vstate)) {
    if (type == vstate.FindDef(id)->opcode()) {
      members.push_back(id);
    }
  }
  return members;
}